

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint8_t *puVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  ulong *puVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  uint8_t *puVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ushort uVar19;
  uint uVar20;
  ulong uVar21;
  uint8_t uVar22;
  uint8_t *puVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  ulong local_120;
  ulong local_118 [2];
  size_t local_108;
  size_t *local_100;
  ulong local_f8;
  ulong local_f0;
  uint8_t *local_e8;
  ulong local_e0;
  size_t local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ContextLut local_b0;
  ulong local_a8;
  int local_9c;
  ulong local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_98 = (position - 7) + num_bytes;
  local_58 = position;
  if (7 < num_bytes) {
    local_58 = local_98;
  }
  local_90 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_90 = 0x40;
  }
  local_120 = *(ulong *)dist_cache;
  local_c0 = position + num_bytes;
  if (local_c0 <= position + 8) {
    local_100 = last_insert_len;
LAB_01be7fd2:
    *(ulong *)dist_cache = (local_120 + local_c0) - position;
    *(long *)commands = *(long *)commands + ((long)local_100 - (long)last_insert_len >> 4);
    return;
  }
  local_b8 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_60 = *(long *)(literal_context_lut + 0x10);
  local_68 = *(long *)(literal_context_lut + 0x60);
  local_a8 = local_90 + position;
  local_108 = (params->dictionary).compound.num_chunks;
  local_d8 = ringbuffer_mask;
  local_88 = ringbuffer_mask & 0xffffffff;
  local_78 = (ulong)(uint)((int)local_90 * 4);
  local_70 = (position - 1) + num_bytes;
  local_100 = last_insert_len;
  local_e8 = ringbuffer;
  local_b0 = literal_context_lut;
  local_38 = position;
LAB_01be74e3:
  uVar16 = local_c0 - local_38;
  uVar17 = local_b8;
  if (local_38 < local_b8) {
    uVar17 = local_38;
  }
  uVar21 = local_38 & ringbuffer_mask;
  puVar1 = ringbuffer + uVar21;
  uVar22 = ringbuffer[uVar21];
  local_f8 = (ulong)*(int *)(hasher->common).extra;
  uVar7 = local_38 - local_f8;
  local_e0 = 0x7e4;
  local_88._0_4_ = (uint)ringbuffer_mask;
  if ((uVar7 < local_38) && (uVar6 = (uint)uVar7 & (uint)local_88, uVar22 == ringbuffer[uVar6])) {
    puVar8 = ringbuffer + uVar6;
    puVar13 = puVar1;
    puVar23 = puVar8;
    uVar7 = uVar16;
    if (7 < uVar16) {
      lVar12 = 0;
      lVar25 = 0;
LAB_01be754f:
      if (*(ulong *)(puVar1 + lVar12) == *(ulong *)(puVar8 + lVar12)) goto code_r0x01be755c;
      uVar15 = *(ulong *)(puVar8 + lVar12) ^ *(ulong *)(puVar1 + lVar12);
      uVar7 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      local_48 = (uVar7 >> 3 & 0x1fffffff) - lVar25;
      goto LAB_01be75ce;
    }
    goto LAB_01be7586;
  }
  goto LAB_01be75f9;
code_r0x01be755c:
  lVar12 = lVar12 + 8;
  lVar24 = uVar16 + lVar25;
  lVar25 = lVar25 + -8;
  if (lVar24 - 8U < 8) goto code_r0x01be7572;
  goto LAB_01be754f;
code_r0x01be7572:
  puVar23 = puVar8 + -lVar25;
  puVar13 = puVar1 + -lVar25;
  uVar7 = lVar25 + uVar16;
LAB_01be7586:
  if (uVar7 != 0) {
    uVar15 = 0;
    do {
      uVar3 = uVar15;
      if (puVar23[uVar15] != puVar13[uVar15]) break;
      uVar15 = uVar15 + 1;
      uVar3 = uVar7;
    } while (uVar7 != uVar15);
    puVar23 = puVar23 + uVar3;
  }
  local_48 = (long)puVar23 - (long)puVar8;
LAB_01be75ce:
  if ((local_48 < 4) || (uVar7 = local_48 * 0x87 + 0x78f, uVar7 < 0x7e5)) {
LAB_01be75f9:
    local_f8 = 0;
    local_48 = 0;
  }
  else {
    uVar22 = puVar1[local_48];
    local_e0 = uVar7;
  }
  local_118[0] = (ulong)(*(long *)(ringbuffer + uVar21) * 0x7bd3579bd3000000) >> 0x30;
  local_118[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar21) * 0x7bd3579bd3000000) >>
                                 0x30) + 8 & 0xffff);
  local_d0 = *(long *)((long)local_118 + (ulong)((uint)local_38 & 8));
  puVar9 = local_118;
  bVar26 = true;
LAB_01be7647:
  uVar6 = *(uint *)(local_108 + *puVar9 * 4);
  puVar13 = ringbuffer + ((uint)local_88 & uVar6);
  if (((uVar22 == puVar13[local_48]) && (local_38 != uVar6)) &&
     (uVar7 = local_38 - uVar6, uVar7 <= uVar17)) {
    puVar23 = puVar13;
    puVar8 = puVar1;
    uVar21 = uVar16;
    if (7 < uVar16) {
      lVar12 = 0;
      lVar25 = 0;
LAB_01be7699:
      if (*(ulong *)(puVar1 + lVar12) == *(ulong *)(puVar13 + lVar12)) goto code_r0x01be76a6;
      uVar15 = *(ulong *)(puVar13 + lVar12) ^ *(ulong *)(puVar1 + lVar12);
      uVar21 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar21 = (uVar21 >> 3 & 0x1fffffff) - lVar25;
      goto LAB_01be770d;
    }
    goto LAB_01be76cb;
  }
  goto LAB_01be7743;
code_r0x01be76a6:
  lVar12 = lVar12 + 8;
  lVar24 = uVar16 + lVar25;
  lVar25 = lVar25 + -8;
  if (lVar24 - 8U < 8) goto code_r0x01be76bc;
  goto LAB_01be7699;
code_r0x01be76bc:
  puVar23 = puVar13 + -lVar25;
  puVar8 = puVar1 + -lVar25;
  uVar21 = lVar25 + uVar16;
LAB_01be76cb:
  if (uVar21 != 0) {
    uVar15 = 0;
    do {
      uVar3 = uVar15;
      if (puVar23[uVar15] != puVar8[uVar15]) break;
      uVar15 = uVar15 + 1;
      uVar3 = uVar21;
    } while (uVar21 != uVar15);
    puVar23 = puVar23 + uVar3;
  }
  uVar21 = (long)puVar23 - (long)puVar13;
LAB_01be770d:
  if (3 < uVar21) {
    iVar14 = 0x1f;
    if ((uint)uVar7 != 0) {
      for (; (uint)uVar7 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar15 = (ulong)(iVar14 * -0x1e + 0x780) + uVar21 * 0x87;
    if (local_e0 < uVar15) {
      uVar22 = puVar1[uVar21];
      local_e0 = uVar15;
      local_f8 = uVar7;
      local_48 = uVar21;
    }
  }
LAB_01be7743:
  puVar9 = local_118 + 1;
  bVar4 = !bVar26;
  bVar26 = false;
  if (bVar4) goto code_r0x01be7756;
  goto LAB_01be7647;
code_r0x01be7756:
  *(uint *)(local_108 + local_d0 * 4) = (uint)local_38;
  if (0x7e4 < local_e0) {
    local_80 = (ulong)*(int *)(hasher->common).extra;
    local_50 = local_120 + 4;
    lVar12 = local_70 - local_38;
    local_9c = 0;
    local_d0 = uVar16;
LAB_01be77b9:
    local_d0 = local_d0 - 1;
    uVar17 = local_48 - 1;
    if (local_d0 <= local_48 - 1) {
      uVar17 = local_d0;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar17 = 0;
    }
    uVar16 = local_38 + 1;
    local_a8 = local_b8;
    if (uVar16 < local_b8) {
      local_a8 = uVar16;
    }
    puVar1 = ringbuffer + (uVar16 & ringbuffer_mask);
    uVar22 = puVar1[uVar17];
    local_c8 = 0x7e4;
    if (uVar16 <= uVar16 - local_80) {
      local_f0 = 0;
      goto LAB_01be791c;
    }
    puVar13 = ringbuffer + ((uint)(uVar16 - local_80) & (uint)local_88);
    if (uVar22 == puVar13[uVar17]) {
      puVar23 = puVar1;
      puVar8 = puVar13;
      uVar7 = local_d0;
      if (7 < local_d0) {
        lVar25 = 0;
        lVar24 = 0;
LAB_01be785c:
        if (*(ulong *)(puVar1 + lVar25) == *(ulong *)(puVar13 + lVar25)) goto code_r0x01be7869;
        uVar21 = *(ulong *)(puVar13 + lVar25) ^ *(ulong *)(puVar1 + lVar25);
        uVar7 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar7 = (uVar7 >> 3 & 0x1fffffff) - lVar24;
        goto LAB_01be78dd;
      }
      goto LAB_01be788e;
    }
    goto LAB_01be7913;
  }
  local_120 = local_120 + 1;
  position = local_38 + 1;
  if (local_a8 < position) {
    if (local_78 + local_a8 < position) {
      uVar17 = local_38 + 0x11;
      if (local_98 <= local_38 + 0x11) {
        uVar17 = local_98;
      }
      for (; position < uVar17; position = position + 4) {
        *(uint *)(local_108 +
                 (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask))
                                               * 0x7bd3579bd3000000) >> 0x30) + ((uint)position & 8)
                        & 0xffff) * 4) = (uint)position;
        local_120 = local_120 + 4;
      }
    }
    else {
      uVar17 = local_38 + 9;
      if (local_98 <= local_38 + 9) {
        uVar17 = local_98;
      }
      for (; position < uVar17; position = position + 2) {
        *(uint *)(local_108 +
                 (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask))
                                               * 0x7bd3579bd3000000) >> 0x30) + ((uint)position & 8)
                        & 0xffff) * 4) = (uint)position;
        local_120 = local_120 + 2;
      }
    }
  }
  goto LAB_01be7f64;
code_r0x01be7869:
  lVar25 = lVar25 + 8;
  lVar2 = lVar12 + lVar24;
  lVar24 = lVar24 + -8;
  if (lVar2 - 8U < 8) goto code_r0x01be787f;
  goto LAB_01be785c;
code_r0x01be787f:
  puVar8 = puVar13 + -lVar24;
  puVar23 = puVar1 + -lVar24;
  uVar7 = lVar24 + lVar12;
LAB_01be788e:
  if (uVar7 != 0) {
    uVar21 = 0;
    do {
      uVar15 = uVar21;
      if (puVar8[uVar21] != puVar23[uVar21]) break;
      uVar21 = uVar21 + 1;
      uVar15 = uVar7;
    } while (uVar7 != uVar21);
    puVar8 = puVar8 + uVar15;
  }
  uVar7 = (long)puVar8 - (long)puVar13;
LAB_01be78dd:
  if ((uVar7 < 4) || (uVar21 = uVar7 * 0x87 + 0x78f, uVar21 < 0x7e5)) {
LAB_01be7913:
    local_f0 = 0;
  }
  else {
    uVar22 = puVar1[uVar7];
    local_c8 = uVar21;
    local_f0 = local_80;
    uVar17 = uVar7;
  }
LAB_01be791c:
  local_118[0] = (ulong)(*(long *)(ringbuffer + (uVar16 & ringbuffer_mask)) * 0x7bd3579bd3000000) >>
                 0x30;
  local_118[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + (uVar16 & ringbuffer_mask)) *
                                         0x7bd3579bd3000000) >> 0x30) + 8 & 0xffff);
  local_40 = *(long *)((long)local_118 + (ulong)((uint)uVar16 & 8));
  puVar9 = local_118;
  bVar26 = true;
LAB_01be795f:
  uVar6 = *(uint *)(local_108 + *puVar9 * 4);
  puVar13 = ringbuffer + ((uint)local_88 & uVar6);
  if (((uVar22 == puVar13[uVar17]) && (uVar16 != uVar6)) &&
     (uVar7 = uVar16 - uVar6, uVar7 <= local_a8)) {
    uVar21 = local_d0;
    puVar23 = puVar13;
    puVar8 = puVar1;
    if (7 < local_d0) {
      lVar24 = 0;
      lVar25 = 0;
LAB_01be79ad:
      if (*(ulong *)(puVar1 + lVar24) == *(ulong *)(puVar13 + lVar24)) goto code_r0x01be79ba;
      uVar15 = *(ulong *)(puVar13 + lVar24) ^ *(ulong *)(puVar1 + lVar24);
      uVar21 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar21 = (uVar21 >> 3 & 0x1fffffff) - lVar25;
      goto LAB_01be7a2c;
    }
    goto LAB_01be79e4;
  }
  goto LAB_01be7a65;
code_r0x01be79ba:
  lVar24 = lVar24 + 8;
  lVar2 = lVar12 + lVar25;
  lVar25 = lVar25 + -8;
  if (lVar2 - 8U < 8) goto code_r0x01be79d0;
  goto LAB_01be79ad;
code_r0x01be79d0:
  puVar23 = puVar13 + -lVar25;
  puVar8 = puVar1 + -lVar25;
  uVar21 = lVar25 + lVar12;
LAB_01be79e4:
  if (uVar21 != 0) {
    uVar15 = 0;
    do {
      uVar3 = uVar15;
      if (puVar23[uVar15] != puVar8[uVar15]) break;
      uVar15 = uVar15 + 1;
      uVar3 = uVar21;
    } while (uVar21 != uVar15);
    puVar23 = puVar23 + uVar3;
  }
  uVar21 = (long)puVar23 - (long)puVar13;
LAB_01be7a2c:
  if (3 < uVar21) {
    iVar14 = 0x1f;
    if ((uint)uVar7 != 0) {
      for (; (uint)uVar7 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar15 = (ulong)(iVar14 * -0x1e + 0x780) + uVar21 * 0x87;
    if (local_c8 < uVar15) {
      uVar22 = puVar1[uVar21];
      local_c8 = uVar15;
      local_f0 = uVar7;
      uVar17 = uVar21;
    }
  }
LAB_01be7a65:
  puVar9 = local_118 + 1;
  bVar4 = !bVar26;
  bVar26 = false;
  if (bVar4) goto code_r0x01be7a7b;
  goto LAB_01be795f;
code_r0x01be7a7b:
  *(uint *)(local_108 + local_40 * 4) = (uint)uVar16;
  uVar7 = local_38;
  uVar21 = local_120;
  if ((local_c8 < local_e0 + 0xaf) ||
     (local_48 = uVar17, local_f8 = local_f0, uVar7 = uVar16, uVar21 = local_50, local_9c == 3))
  goto LAB_01be7bbc;
  local_120 = local_120 + 1;
  local_9c = local_9c + 1;
  uVar17 = local_38 + 9;
  lVar12 = lVar12 + -1;
  local_e0 = local_c8;
  local_38 = uVar16;
  uVar21 = local_120;
  if (local_c0 <= uVar17) goto LAB_01be7bbc;
  goto LAB_01be77b9;
LAB_01be7bbc:
  local_120 = uVar21;
  uVar17 = local_60 + uVar7;
  if (local_b8 <= uVar17) {
    uVar17 = local_b8;
  }
  uVar17 = uVar17 + local_68;
  uVar18 = (uint)local_120;
  uVar6 = (uint)local_48;
  if (uVar17 < local_f8) {
LAB_01be7be7:
    uVar21 = local_f8 + 0xf;
LAB_01be7bec:
    if ((local_f8 <= uVar17) && (uVar21 != 0)) {
      *(undefined4 *)((long)(hasher->common).extra + 0xc) =
           *(undefined4 *)((hasher->common).extra + 1);
      *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
      *(int *)(hasher->common).extra = (int)local_f8;
    }
    *(uint *)local_100 = uVar18;
    *(uint *)((long)local_100 + 4) = uVar6;
    uVar17 = (ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10;
    uVar11 = 0;
    if (uVar17 <= uVar21) {
      bVar10 = (byte)*(uint *)(literal_context_lut + 0x38);
      uVar16 = ((uVar21 - *(uint *)(literal_context_lut + 0x3c)) + (4L << (bVar10 & 0x3f))) - 0x10;
      uVar20 = 0x1f;
      uVar11 = (uint)uVar16;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = (uVar20 ^ 0xffffffe0) + 0x1f;
      uVar15 = (ulong)((uVar16 >> ((ulong)uVar20 & 0x3f) & 1) != 0);
      lVar12 = (ulong)uVar20 - (ulong)*(uint *)(literal_context_lut + 0x38);
      uVar21 = (~(-1 << (bVar10 & 0x1f)) & uVar11) + uVar17 +
               (uVar15 + lVar12 * 2 + 0xfffe << (bVar10 & 0x3f)) | lVar12 * 0x400;
      uVar11 = (uint)(uVar16 - (uVar15 + 2 << ((byte)uVar20 & 0x3f)) >> (bVar10 & 0x3f));
    }
    uVar20 = (uint)uVar21;
  }
  else {
    uVar16 = (ulong)*(int *)(hasher->common).extra;
    if (local_f8 != uVar16) {
      uVar15 = (ulong)*(int *)((long)(hasher->common).extra + 4);
      uVar21 = 1;
      if (local_f8 != uVar15) {
        uVar16 = (local_f8 + 3) - uVar16;
        if (uVar16 < 7) {
          bVar10 = (byte)((int)uVar16 << 2);
          uVar20 = 0x9750468;
        }
        else {
          uVar15 = (local_f8 + 3) - uVar15;
          if (6 < uVar15) {
            uVar21 = 2;
            if ((local_f8 != (long)*(int *)((hasher->common).extra + 1)) &&
               (uVar21 = 3, local_f8 != (long)*(int *)((long)(hasher->common).extra + 0xc)))
            goto LAB_01be7be7;
            goto LAB_01be7bec;
          }
          bVar10 = (byte)((int)uVar15 << 2);
          uVar20 = 0xfdb1ace;
        }
        uVar21 = (ulong)(uVar20 >> (bVar10 & 0x1f) & 0xf);
      }
      goto LAB_01be7bec;
    }
    *(uint *)local_100 = uVar18;
    *(uint *)((long)local_100 + 4) = uVar6;
    uVar20 = 0;
    uVar11 = 0;
  }
  *(short *)((long)local_100 + 0xe) = (short)uVar20;
  *(uint *)(local_100 + 1) = uVar11;
  if (5 < local_120) {
    if (local_120 < 0x82) {
      uVar18 = 0x1f;
      uVar11 = (uint)(local_120 - 2);
      if (uVar11 != 0) {
        for (; uVar11 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar18 = (int)(local_120 - 2 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar18 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_120 < 0x842) {
      uVar11 = 0x1f;
      if (uVar18 - 0x42 != 0) {
        for (; uVar18 - 0x42 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar18 = (uVar11 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar18 = 0x15;
      if (0x1841 < local_120) {
        uVar18 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
      }
    }
  }
  uVar17 = (ulong)(int)uVar6;
  if (uVar17 < 10) {
    uVar11 = uVar6 - 2;
  }
  else if (uVar17 < 0x86) {
    uVar6 = 0x1f;
    uVar11 = (uint)(uVar17 - 6);
    if (uVar11 != 0) {
      for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar11 = (int)(uVar17 - 6 >> ((char)(uVar6 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar6 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar11 = 0x17;
    if (uVar17 < 0x846) {
      uVar11 = 0x1f;
      if (uVar6 - 0x46 != 0) {
        for (; uVar6 - 0x46 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar11;
  uVar19 = (uVar5 & 7) + ((ushort)uVar18 & 7) * 8;
  if ((((uVar20 & 0x3ff) == 0) && ((ushort)uVar18 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar19 = uVar19 | 0x40;
    }
  }
  else {
    iVar14 = ((uVar18 & 0xffff) >> 3) * 3 + ((uVar11 & 0xffff) >> 3);
    uVar19 = uVar19 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar14 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_100 + 0xc) = uVar19;
  *num_commands = *num_commands + local_120;
  position = local_48 + uVar7;
  uVar17 = local_58;
  if (position < local_58) {
    uVar17 = position;
  }
  uVar16 = uVar7 + 2;
  if (local_f8 < local_48 >> 2) {
    uVar21 = position + local_f8 * -4;
    if (uVar21 < uVar16) {
      uVar21 = uVar16;
    }
    uVar16 = uVar21;
    if (uVar17 < uVar21) {
      uVar16 = uVar17;
    }
  }
  local_a8 = local_48 * 2 + uVar7 + local_90;
  local_100 = local_100 + 2;
  if (uVar16 < uVar17) {
    do {
      *(uint *)(local_108 +
               (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer + (uVar16 & ringbuffer_mask)) *
                                             0x7bd3579bd3000000) >> 0x30) + ((uint)uVar16 & 8) &
                      0xffff) * 4) = (uint)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
    local_120 = 0;
  }
  else {
    local_120 = 0;
  }
LAB_01be7f64:
  local_38 = position;
  if (local_c0 <= position + 8) goto LAB_01be7fd2;
  goto LAB_01be74e3;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}